

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O2

ssize_t __thiscall DomProperty::read(DomProperty *this,int __fd,void *__buf,size_t __nbytes)

{
  double a;
  bool bVar1;
  int iVar2;
  uint a_00;
  DomColor *this_00;
  DomFont *this_01;
  DomResourceIcon *this_02;
  DomResourcePixmap *this_03;
  DomPalette *this_04;
  DomPoint *this_05;
  DomRect *this_06;
  DomLocale *this_07;
  DomSizePolicy *this_08;
  DomSize *this_09;
  DomString *this_10;
  DomStringList *this_11;
  DomDate *this_12;
  DomTime *this_13;
  DomDateTime *this_14;
  DomPointF *this_15;
  DomRectF *this_16;
  DomSizeF *this_17;
  qint64 a_01;
  DomChar *this_18;
  DomUrl *this_19;
  quint64 a_02;
  DomBrush *this_20;
  size_t sVar3;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  void *__buf_07;
  void *__buf_08;
  void *__buf_09;
  void *__buf_10;
  void *__buf_11;
  void *__buf_12;
  void *__buf_13;
  void *__buf_14;
  void *__buf_15;
  void *__buf_16;
  void *__buf_17;
  void *__buf_18;
  void *__buf_19;
  void *__buf_20;
  QXmlStreamAttribute *attribute;
  QXmlStreamAttribute *pQVar4;
  undefined4 in_register_00000034;
  QXmlStreamReader *this_21;
  long lVar5;
  long in_FS_OFFSET;
  float a_03;
  QStringView other;
  QStringView other_00;
  QStringView other_01;
  QStringView other_02;
  QStringView other_03;
  QStringView other_04;
  QStringView other_05;
  QStringView other_06;
  QStringView other_07;
  QStringView other_08;
  QStringView other_09;
  QStringView other_10;
  QStringView other_11;
  QStringView other_12;
  QStringView other_13;
  QStringView other_14;
  QStringView other_15;
  QStringView other_16;
  QStringView other_17;
  QStringView other_18;
  QStringView other_19;
  QStringView other_20;
  QStringView other_21;
  QStringView other_22;
  QStringView other_23;
  QStringView other_24;
  QStringView other_25;
  QStringView other_26;
  QStringView other_27;
  QStringView other_28;
  QStringView other_29;
  QStringView other_30;
  QStringView other_31;
  QStringBuilder<QLatin1String,_const_QStringView_&> local_98;
  QArrayDataPointer<char16_t> local_80;
  QStringView local_68;
  QArrayDataPointer<QXmlStreamAttribute> local_50;
  long local_38;
  
  this_21 = (QXmlStreamReader *)CONCAT44(in_register_00000034,__fd);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QXmlStreamReader::attributes();
  pQVar4 = local_50.ptr;
  for (lVar5 = 0; local_50.size * 0x68 != lVar5; lVar5 = lVar5 + 0x68) {
    local_68.m_data = *(storage_type_conflict **)(pQVar4 + 8);
    local_68.m_size = *(qsizetype *)(pQVar4 + 0x10);
    Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"name",4);
    local_98.a.m_size = local_80.size;
    local_98.a.m_data = (char *)local_80.ptr;
    bVar1 = comparesEqual(&local_68,(QStringView *)&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    if (bVar1) {
      local_98.a.m_data = *(char **)(local_50.ptr + lVar5 + 0x50);
      local_98.a.m_size = *(qsizetype *)(local_50.ptr + lVar5 + 0x58);
      QStringView::toString((QString *)&local_80,(QStringView *)&local_98);
      setAttributeName(this,(QString *)&local_80);
LAB_001510ee:
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    }
    else {
      Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"stdset",6);
      local_98.a.m_size = local_80.size;
      local_98.a.m_data = (char *)local_80.ptr;
      bVar1 = comparesEqual(&local_68,(QStringView *)&local_98);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
      if (!bVar1) {
        local_98.a.m_size = 0x15;
        local_98.a.m_data = "Unexpected attribute ";
        local_98.b = &local_68;
        QStringBuilder<QLatin1String,_const_QStringView_&>::convertTo<QString>
                  ((QString *)&local_80,&local_98);
        QXmlStreamReader::raiseError((QString *)this_21);
        goto LAB_001510ee;
      }
      local_80.ptr = *(char16_t **)(local_50.ptr + lVar5 + 0x50);
      local_80.d = *(Data **)(local_50.ptr + lVar5 + 0x58);
      iVar2 = QStringView::toInt((QStringView *)&local_80,(bool *)0x0,10);
      this->m_attr_stdset = iVar2;
      this->m_has_attr_stdset = true;
    }
    pQVar4 = pQVar4 + 0x68;
  }
LAB_00151113:
  while( true ) {
    bVar1 = QXmlStreamReader::hasError(this_21);
    if (bVar1) goto LAB_00151eda;
    iVar2 = QXmlStreamReader::readNext();
    if (iVar2 == 4) break;
    if (iVar2 == 5) {
LAB_00151eda:
      QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer(&local_50);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return *(long *)(in_FS_OFFSET + 0x28);
    }
  }
  local_68.m_size = -0x5555555555555556;
  local_68.m_data = (storage_type_conflict *)0xaaaaaaaaaaaaaaaa;
  local_68 = (QStringView)QXmlStreamReader::name();
  Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"bool",4);
  other.m_data = local_80.ptr;
  other.m_size = local_80.size;
  iVar2 = QStringView::compare(&local_68,other,CaseInsensitive);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
  if (iVar2 == 0) {
    QXmlStreamReader::readElementText(&local_80,this_21,0);
    setElementBool(this,(QString *)&local_80);
  }
  else {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"color",5);
    sVar3 = 0;
    other_00.m_data = local_80.ptr;
    other_00.m_size = local_80.size;
    iVar2 = QStringView::compare(&local_68,other_00,CaseInsensitive);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    if (iVar2 == 0) {
      this_00 = (DomColor *)operator_new(0x18);
      this_00->m_attr_alpha = 0;
      this_00->m_has_attr_alpha = false;
      *(undefined3 *)&this_00->field_0x5 = 0;
      this_00->m_children = 0;
      this_00->m_red = 0;
      this_00->m_green = 0;
      this_00->m_blue = 0;
      DomColor::read(this_00,__fd,__buf_00,sVar3);
      setElementColor(this,this_00);
      goto LAB_00151113;
    }
    Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"cstring",7);
    other_01.m_data = local_80.ptr;
    other_01.m_size = local_80.size;
    iVar2 = QStringView::compare(&local_68,other_01,CaseInsensitive);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    if (iVar2 == 0) {
      QXmlStreamReader::readElementText(&local_80,this_21,0);
      setElementCstring(this,(QString *)&local_80);
    }
    else {
      Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"cursor",6);
      other_02.m_data = local_80.ptr;
      other_02.m_size = local_80.size;
      iVar2 = QStringView::compare(&local_68,other_02,CaseInsensitive);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
      if (iVar2 == 0) {
        QXmlStreamReader::readElementText(&local_80,this_21,0);
        iVar2 = QString::toInt((QString *)&local_80,(bool *)0x0,10);
        setElementCursor(this,iVar2);
      }
      else {
        Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"cursorshape",0xb);
        other_03.m_data = local_80.ptr;
        other_03.m_size = local_80.size;
        iVar2 = QStringView::compare(&local_68,other_03,CaseInsensitive);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
        if (iVar2 == 0) {
          QXmlStreamReader::readElementText(&local_80,this_21,0);
          setElementCursorShape(this,(QString *)&local_80);
        }
        else {
          Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"enum",4);
          other_04.m_data = local_80.ptr;
          other_04.m_size = local_80.size;
          iVar2 = QStringView::compare(&local_68,other_04,CaseInsensitive);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
          if (iVar2 == 0) {
            QXmlStreamReader::readElementText(&local_80,this_21,0);
            setElementEnum(this,(QString *)&local_80);
          }
          else {
            Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"font",4);
            sVar3 = 0;
            other_05.m_data = local_80.ptr;
            other_05.m_size = local_80.size;
            iVar2 = QStringView::compare(&local_68,other_05,CaseInsensitive);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
            if (iVar2 == 0) {
              this_01 = (DomFont *)operator_new(0x80);
              *(undefined8 *)this_01 = 0;
              (this_01->m_family).d.d = (Data *)0x0;
              (this_01->m_family).d.ptr = (char16_t *)0x0;
              (this_01->m_family).d.size = 0;
              this_01->m_pointSize = 0;
              this_01->m_weight = 0;
              this_01->m_italic = false;
              this_01->m_bold = false;
              this_01->m_underline = false;
              this_01->m_strikeOut = false;
              this_01->m_antialiasing = false;
              *(undefined3 *)&this_01->field_0x2d = 0;
              (this_01->m_styleStrategy).d.d = (Data *)0x0;
              (this_01->m_styleStrategy).d.ptr = (char16_t *)0x0;
              (this_01->m_styleStrategy).d.size = 0;
              *(undefined8 *)&this_01->m_kerning = 0;
              (this_01->m_hintingPreference).d.d = (Data *)0x0;
              (this_01->m_hintingPreference).d.ptr = (char16_t *)0x0;
              (this_01->m_hintingPreference).d.size = 0;
              (this_01->m_fontWeight).d.d = (Data *)0x0;
              (this_01->m_fontWeight).d.ptr = (char16_t *)0x0;
              (this_01->m_fontWeight).d.size = 0;
              DomFont::read(this_01,__fd,__buf_01,sVar3);
              setElementFont(this,this_01);
              goto LAB_00151113;
            }
            Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"iconset",7);
            sVar3 = 0;
            other_06.m_data = local_80.ptr;
            other_06.m_size = local_80.size;
            iVar2 = QStringView::compare(&local_68,other_06,CaseInsensitive);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
            if (iVar2 == 0) {
              this_02 = (DomResourceIcon *)operator_new(0x98);
              memset(this_02,0,0x98);
              DomResourceIcon::read(this_02,__fd,__buf_02,sVar3);
              setElementIconSet(this,this_02);
              goto LAB_00151113;
            }
            Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"pixmap",6);
            sVar3 = 0;
            other_07.m_data = local_80.ptr;
            other_07.m_size = local_80.size;
            iVar2 = QStringView::compare(&local_68,other_07,CaseInsensitive);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
            if (iVar2 == 0) {
              this_03 = (DomResourcePixmap *)operator_new(0x58);
              (this_03->m_text).d.d = (Data *)0x0;
              (this_03->m_text).d.ptr = (char16_t *)0x0;
              (this_03->m_text).d.size = 0;
              (this_03->m_attr_resource).d.d = (Data *)0x0;
              (this_03->m_attr_resource).d.ptr = (char16_t *)0x0;
              (this_03->m_attr_resource).d.size = 0;
              *(undefined8 *)&this_03->m_has_attr_resource = 0;
              (this_03->m_attr_alias).d.d = (Data *)0x0;
              (this_03->m_attr_alias).d.ptr = (char16_t *)0x0;
              (this_03->m_attr_alias).d.size = 0;
              *(undefined8 *)&this_03->m_has_attr_alias = 0;
              DomResourcePixmap::read(this_03,__fd,__buf_03,sVar3);
              setElementPixmap(this,this_03);
              goto LAB_00151113;
            }
            Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"palette",7);
            sVar3 = 0;
            other_08.m_data = local_80.ptr;
            other_08.m_size = local_80.size;
            iVar2 = QStringView::compare(&local_68,other_08,CaseInsensitive);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
            if (iVar2 == 0) {
              this_04 = (DomPalette *)operator_new(0x20);
              *(undefined8 *)this_04 = 0;
              this_04->m_active = (DomColorGroup *)0x0;
              this_04->m_inactive = (DomColorGroup *)0x0;
              this_04->m_disabled = (DomColorGroup *)0x0;
              DomPalette::read(this_04,__fd,__buf_04,sVar3);
              setElementPalette(this,this_04);
              goto LAB_00151113;
            }
            Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"point",5);
            sVar3 = 0;
            other_09.m_data = local_80.ptr;
            other_09.m_size = local_80.size;
            iVar2 = QStringView::compare(&local_68,other_09,CaseInsensitive);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
            if (iVar2 == 0) {
              this_05 = (DomPoint *)operator_new(0xc);
              this_05->m_children = 0;
              this_05->m_x = 0;
              this_05->m_y = 0;
              DomPoint::read(this_05,__fd,__buf_05,sVar3);
              setElementPoint(this,this_05);
              goto LAB_00151113;
            }
            Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"rect",4);
            sVar3 = 0;
            other_10.m_data = local_80.ptr;
            other_10.m_size = local_80.size;
            iVar2 = QStringView::compare(&local_68,other_10,CaseInsensitive);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
            if (iVar2 == 0) {
              this_06 = (DomRect *)operator_new(0x14);
              this_06->m_children = 0;
              this_06->m_x = 0;
              this_06->m_y = 0;
              this_06->m_width = 0;
              this_06->m_height = 0;
              DomRect::read(this_06,__fd,__buf_06,sVar3);
              setElementRect(this,this_06);
              goto LAB_00151113;
            }
            Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"set",3);
            other_11.m_data = local_80.ptr;
            other_11.m_size = local_80.size;
            iVar2 = QStringView::compare(&local_68,other_11,CaseInsensitive);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
            if (iVar2 == 0) {
              QXmlStreamReader::readElementText(&local_80,this_21,0);
              setElementSet(this,(QString *)&local_80);
            }
            else {
              Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"locale",6);
              sVar3 = 0;
              other_12.m_data = local_80.ptr;
              other_12.m_size = local_80.size;
              iVar2 = QStringView::compare(&local_68,other_12,CaseInsensitive);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
              if (iVar2 == 0) {
                this_07 = (DomLocale *)operator_new(0x40);
                (this_07->m_attr_language).d.d = (Data *)0x0;
                (this_07->m_attr_language).d.ptr = (char16_t *)0x0;
                (this_07->m_attr_language).d.size = 0;
                *(undefined8 *)&this_07->m_has_attr_language = 0;
                (this_07->m_attr_country).d.d = (Data *)0x0;
                (this_07->m_attr_country).d.ptr = (char16_t *)0x0;
                (this_07->m_attr_country).d.size = 0;
                *(undefined8 *)&this_07->m_has_attr_country = 0;
                DomLocale::read(this_07,__fd,__buf_07,sVar3);
                setElementLocale(this,this_07);
                goto LAB_00151113;
              }
              Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"sizepolicy",10);
              sVar3 = 0;
              other_13.m_data = local_80.ptr;
              other_13.m_size = local_80.size;
              iVar2 = QStringView::compare(&local_68,other_13,CaseInsensitive);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
              if (iVar2 == 0) {
                this_08 = (DomSizePolicy *)operator_new(0x50);
                (this_08->m_attr_hSizeType).d.d = (Data *)0x0;
                (this_08->m_attr_hSizeType).d.ptr = (char16_t *)0x0;
                (this_08->m_attr_hSizeType).d.size = 0;
                *(undefined8 *)&this_08->m_has_attr_hSizeType = 0;
                (this_08->m_attr_vSizeType).d.d = (Data *)0x0;
                (this_08->m_attr_vSizeType).d.ptr = (char16_t *)0x0;
                (this_08->m_attr_vSizeType).d.size = 0;
                this_08->m_has_attr_vSizeType = false;
                *(undefined3 *)&this_08->field_0x39 = 0;
                this_08->m_children = 0;
                this_08->m_hSizeType = 0;
                this_08->m_vSizeType = 0;
                this_08->m_horStretch = 0;
                this_08->m_verStretch = 0;
                DomSizePolicy::read(this_08,__fd,__buf_08,sVar3);
                setElementSizePolicy(this,this_08);
                goto LAB_00151113;
              }
              Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"size",4);
              sVar3 = 0;
              other_14.m_data = local_80.ptr;
              other_14.m_size = local_80.size;
              iVar2 = QStringView::compare(&local_68,other_14,CaseInsensitive);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
              if (iVar2 == 0) {
                this_09 = (DomSize *)operator_new(0xc);
                this_09->m_children = 0;
                this_09->m_width = 0;
                this_09->m_height = 0;
                DomSize::read(this_09,__fd,__buf_09,sVar3);
                setElementSize(this,this_09);
                goto LAB_00151113;
              }
              Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"string",6);
              sVar3 = 0;
              other_15.m_data = local_80.ptr;
              other_15.m_size = local_80.size;
              iVar2 = QStringView::compare(&local_68,other_15,CaseInsensitive);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
              if (iVar2 == 0) {
                this_10 = (DomString *)operator_new(0x98);
                memset(this_10,0,0x98);
                DomString::read(this_10,__fd,__buf_10,sVar3);
                setElementString(this,this_10);
                goto LAB_00151113;
              }
              Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"stringlist",10);
              sVar3 = 0;
              other_16.m_data = local_80.ptr;
              other_16.m_size = local_80.size;
              iVar2 = QStringView::compare(&local_68,other_16,CaseInsensitive);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
              if (iVar2 == 0) {
                this_11 = (DomStringList *)operator_new(0x98);
                memset(this_11,0,0x98);
                DomStringList::read(this_11,__fd,__buf_11,sVar3);
                setElementStringList(this,this_11);
                goto LAB_00151113;
              }
              Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"number",6);
              other_17.m_data = local_80.ptr;
              other_17.m_size = local_80.size;
              iVar2 = QStringView::compare(&local_68,other_17,CaseInsensitive);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
              if (iVar2 == 0) {
                QXmlStreamReader::readElementText(&local_80,this_21,0);
                iVar2 = QString::toInt((QString *)&local_80,(bool *)0x0,10);
                setElementNumber(this,iVar2);
              }
              else {
                Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"float",5);
                other_18.m_data = local_80.ptr;
                other_18.m_size = local_80.size;
                iVar2 = QStringView::compare(&local_68,other_18,CaseInsensitive);
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
                if (iVar2 == 0) {
                  QXmlStreamReader::readElementText(&local_80,this_21,0);
                  a_03 = (float)QString::toFloat((bool *)&local_80);
                  setElementFloat(this,a_03);
                }
                else {
                  Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"double",6);
                  other_19.m_data = local_80.ptr;
                  other_19.m_size = local_80.size;
                  iVar2 = QStringView::compare(&local_68,other_19,CaseInsensitive);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
                  if (iVar2 == 0) {
                    QXmlStreamReader::readElementText(&local_80,this_21,0);
                    a = (double)QString::toDouble((bool *)&local_80);
                    setElementDouble(this,a);
                  }
                  else {
                    Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"date",4);
                    sVar3 = 0;
                    other_20.m_data = local_80.ptr;
                    other_20.m_size = local_80.size;
                    iVar2 = QStringView::compare(&local_68,other_20,CaseInsensitive);
                    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
                    if (iVar2 == 0) {
                      this_12 = (DomDate *)operator_new(0x10);
                      this_12->m_children = 0;
                      this_12->m_year = 0;
                      this_12->m_month = 0;
                      this_12->m_day = 0;
                      DomDate::read(this_12,__fd,__buf_12,sVar3);
                      setElementDate(this,this_12);
                      goto LAB_00151113;
                    }
                    Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"time",4);
                    sVar3 = 0;
                    other_21.m_data = local_80.ptr;
                    other_21.m_size = local_80.size;
                    iVar2 = QStringView::compare(&local_68,other_21,CaseInsensitive);
                    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
                    if (iVar2 == 0) {
                      this_13 = (DomTime *)operator_new(0x10);
                      this_13->m_children = 0;
                      this_13->m_hour = 0;
                      this_13->m_minute = 0;
                      this_13->m_second = 0;
                      DomTime::read(this_13,__fd,__buf_13,sVar3);
                      setElementTime(this,this_13);
                      goto LAB_00151113;
                    }
                    Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"datetime",8);
                    sVar3 = 0;
                    other_22.m_data = local_80.ptr;
                    other_22.m_size = local_80.size;
                    iVar2 = QStringView::compare(&local_68,other_22,CaseInsensitive);
                    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
                    if (iVar2 == 0) {
                      this_14 = (DomDateTime *)operator_new(0x1c);
                      this_14->m_children = 0;
                      this_14->m_hour = 0;
                      this_14->m_minute = 0;
                      this_14->m_second = 0;
                      this_14->m_second = 0;
                      this_14->m_year = 0;
                      this_14->m_month = 0;
                      this_14->m_day = 0;
                      DomDateTime::read(this_14,__fd,__buf_14,sVar3);
                      setElementDateTime(this,this_14);
                      goto LAB_00151113;
                    }
                    Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"pointf",6);
                    sVar3 = 0;
                    other_23.m_data = local_80.ptr;
                    other_23.m_size = local_80.size;
                    iVar2 = QStringView::compare(&local_68,other_23,CaseInsensitive);
                    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
                    if (iVar2 == 0) {
                      this_15 = (DomPointF *)operator_new(0x18);
                      *(undefined8 *)this_15 = 0;
                      this_15->m_x = 0.0;
                      this_15->m_y = 0.0;
                      DomPointF::read(this_15,__fd,__buf_15,sVar3);
                      setElementPointF(this,this_15);
                      goto LAB_00151113;
                    }
                    Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"rectf",5);
                    sVar3 = 0;
                    other_24.m_data = local_80.ptr;
                    other_24.m_size = local_80.size;
                    iVar2 = QStringView::compare(&local_68,other_24,CaseInsensitive);
                    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
                    if (iVar2 == 0) {
                      this_16 = (DomRectF *)operator_new(0x28);
                      *(undefined8 *)this_16 = 0;
                      this_16->m_x = 0.0;
                      this_16->m_y = 0.0;
                      this_16->m_width = 0.0;
                      this_16->m_height = 0.0;
                      DomRectF::read(this_16,__fd,__buf_16,sVar3);
                      setElementRectF(this,this_16);
                      goto LAB_00151113;
                    }
                    Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"sizef",5);
                    sVar3 = 0;
                    other_25.m_data = local_80.ptr;
                    other_25.m_size = local_80.size;
                    iVar2 = QStringView::compare(&local_68,other_25,CaseInsensitive);
                    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
                    if (iVar2 == 0) {
                      this_17 = (DomSizeF *)operator_new(0x18);
                      *(undefined8 *)this_17 = 0;
                      this_17->m_width = 0.0;
                      this_17->m_height = 0.0;
                      DomSizeF::read(this_17,__fd,__buf_17,sVar3);
                      setElementSizeF(this,this_17);
                      goto LAB_00151113;
                    }
                    Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"longlong",8);
                    other_26.m_data = local_80.ptr;
                    other_26.m_size = local_80.size;
                    iVar2 = QStringView::compare(&local_68,other_26,CaseInsensitive);
                    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
                    if (iVar2 == 0) {
                      QXmlStreamReader::readElementText(&local_80,this_21,0);
                      a_01 = QString::toLongLong((QString *)&local_80,(bool *)0x0,10);
                      setElementLongLong(this,a_01);
                    }
                    else {
                      Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"char",4);
                      sVar3 = 0;
                      other_27.m_data = local_80.ptr;
                      other_27.m_size = local_80.size;
                      iVar2 = QStringView::compare(&local_68,other_27,CaseInsensitive);
                      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
                      if (iVar2 == 0) {
                        this_18 = (DomChar *)operator_new(8);
                        this_18->m_children = 0;
                        this_18->m_unicode = 0;
                        DomChar::read(this_18,__fd,__buf_18,sVar3);
                        setElementChar(this,this_18);
                        goto LAB_00151113;
                      }
                      Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"url",3);
                      sVar3 = 0;
                      other_28.m_data = local_80.ptr;
                      other_28.m_size = local_80.size;
                      iVar2 = QStringView::compare(&local_68,other_28,CaseInsensitive);
                      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
                      if (iVar2 == 0) {
                        this_19 = (DomUrl *)operator_new(0x10);
                        *(undefined8 *)this_19 = 0;
                        this_19->m_string = (DomString *)0x0;
                        DomUrl::read(this_19,__fd,__buf_19,sVar3);
                        setElementUrl(this,this_19);
                        goto LAB_00151113;
                      }
                      Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"uint",4);
                      other_29.m_data = local_80.ptr;
                      other_29.m_size = local_80.size;
                      iVar2 = QStringView::compare(&local_68,other_29,CaseInsensitive);
                      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
                      if (iVar2 == 0) {
                        QXmlStreamReader::readElementText(&local_80,this_21,0);
                        a_00 = QString::toUInt((QString *)&local_80,(bool *)0x0,10);
                        setElementUInt(this,a_00);
                      }
                      else {
                        Qt::Literals::StringLiterals::operator____s
                                  ((QString *)&local_80,L"ulonglong",9);
                        other_30.m_data = local_80.ptr;
                        other_30.m_size = local_80.size;
                        iVar2 = QStringView::compare(&local_68,other_30,CaseInsensitive);
                        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
                        if (iVar2 == 0) {
                          QXmlStreamReader::readElementText(&local_80,this_21,0);
                          a_02 = QString::toULongLong((QString *)&local_80,(bool *)0x0,10);
                          setElementULongLong(this,a_02);
                        }
                        else {
                          Qt::Literals::StringLiterals::operator____s
                                    ((QString *)&local_80,L"brush",5);
                          sVar3 = 0;
                          other_31.m_data = local_80.ptr;
                          other_31.m_size = local_80.size;
                          iVar2 = QStringView::compare(&local_68,other_31,CaseInsensitive);
                          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
                          if (iVar2 == 0) {
                            this_20 = (DomBrush *)operator_new(0x38);
                            (this_20->m_attr_brushStyle).d.d = (Data *)0x0;
                            (this_20->m_attr_brushStyle).d.ptr = (char16_t *)0x0;
                            (this_20->m_attr_brushStyle).d.size = 0;
                            this_20->m_has_attr_brushStyle = false;
                            *(undefined3 *)&this_20->field_0x19 = 0;
                            this_20->m_kind = Unknown;
                            this_20->m_color = (DomColor *)0x0;
                            this_20->m_texture = (DomProperty *)0x0;
                            this_20->m_gradient = (DomGradient *)0x0;
                            DomBrush::read(this_20,__fd,__buf_20,sVar3);
                            setElementBrush(this,this_20);
                            goto LAB_00151113;
                          }
                          local_98.a.m_size = 0x13;
                          local_98.a.m_data = "Unexpected element ";
                          local_98.b = &local_68;
                          QStringBuilder<QLatin1String,_const_QStringView_&>::convertTo<QString>
                                    ((QString *)&local_80,&local_98);
                          QXmlStreamReader::raiseError((QString *)this_21);
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
  goto LAB_00151113;
}

Assistant:

void DomProperty::read(QXmlStreamReader &reader)
{
    const QXmlStreamAttributes &attributes = reader.attributes();
    for (const QXmlStreamAttribute &attribute : attributes) {
        const auto name = attribute.name();
        if (name == u"name"_s) {
            setAttributeName(attribute.value().toString());
            continue;
        }
        if (name == u"stdset"_s) {
            setAttributeStdset(attribute.value().toInt());
            continue;
        }
        reader.raiseError("Unexpected attribute "_L1 + name);
    }

    while (!reader.hasError()) {
        switch (reader.readNext()) {
        case QXmlStreamReader::StartElement : {
            const auto tag = reader.name();
            if (!tag.compare(u"bool"_s, Qt::CaseInsensitive)) {
                setElementBool(reader.readElementText());
                continue;
            }
            if (!tag.compare(u"color"_s, Qt::CaseInsensitive)) {
                auto *v = new DomColor();
                v->read(reader);
                setElementColor(v);
                continue;
            }
            if (!tag.compare(u"cstring"_s, Qt::CaseInsensitive)) {
                setElementCstring(reader.readElementText());
                continue;
            }
            if (!tag.compare(u"cursor"_s, Qt::CaseInsensitive)) {
                setElementCursor(reader.readElementText().toInt());
                continue;
            }
            if (!tag.compare(u"cursorshape"_s, Qt::CaseInsensitive)) {
                setElementCursorShape(reader.readElementText());
                continue;
            }
            if (!tag.compare(u"enum"_s, Qt::CaseInsensitive)) {
                setElementEnum(reader.readElementText());
                continue;
            }
            if (!tag.compare(u"font"_s, Qt::CaseInsensitive)) {
                auto *v = new DomFont();
                v->read(reader);
                setElementFont(v);
                continue;
            }
            if (!tag.compare(u"iconset"_s, Qt::CaseInsensitive)) {
                auto *v = new DomResourceIcon();
                v->read(reader);
                setElementIconSet(v);
                continue;
            }
            if (!tag.compare(u"pixmap"_s, Qt::CaseInsensitive)) {
                auto *v = new DomResourcePixmap();
                v->read(reader);
                setElementPixmap(v);
                continue;
            }
            if (!tag.compare(u"palette"_s, Qt::CaseInsensitive)) {
                auto *v = new DomPalette();
                v->read(reader);
                setElementPalette(v);
                continue;
            }
            if (!tag.compare(u"point"_s, Qt::CaseInsensitive)) {
                auto *v = new DomPoint();
                v->read(reader);
                setElementPoint(v);
                continue;
            }
            if (!tag.compare(u"rect"_s, Qt::CaseInsensitive)) {
                auto *v = new DomRect();
                v->read(reader);
                setElementRect(v);
                continue;
            }
            if (!tag.compare(u"set"_s, Qt::CaseInsensitive)) {
                setElementSet(reader.readElementText());
                continue;
            }
            if (!tag.compare(u"locale"_s, Qt::CaseInsensitive)) {
                auto *v = new DomLocale();
                v->read(reader);
                setElementLocale(v);
                continue;
            }
            if (!tag.compare(u"sizepolicy"_s, Qt::CaseInsensitive)) {
                auto *v = new DomSizePolicy();
                v->read(reader);
                setElementSizePolicy(v);
                continue;
            }
            if (!tag.compare(u"size"_s, Qt::CaseInsensitive)) {
                auto *v = new DomSize();
                v->read(reader);
                setElementSize(v);
                continue;
            }
            if (!tag.compare(u"string"_s, Qt::CaseInsensitive)) {
                auto *v = new DomString();
                v->read(reader);
                setElementString(v);
                continue;
            }
            if (!tag.compare(u"stringlist"_s, Qt::CaseInsensitive)) {
                auto *v = new DomStringList();
                v->read(reader);
                setElementStringList(v);
                continue;
            }
            if (!tag.compare(u"number"_s, Qt::CaseInsensitive)) {
                setElementNumber(reader.readElementText().toInt());
                continue;
            }
            if (!tag.compare(u"float"_s, Qt::CaseInsensitive)) {
                setElementFloat(reader.readElementText().toFloat());
                continue;
            }
            if (!tag.compare(u"double"_s, Qt::CaseInsensitive)) {
                setElementDouble(reader.readElementText().toDouble());
                continue;
            }
            if (!tag.compare(u"date"_s, Qt::CaseInsensitive)) {
                auto *v = new DomDate();
                v->read(reader);
                setElementDate(v);
                continue;
            }
            if (!tag.compare(u"time"_s, Qt::CaseInsensitive)) {
                auto *v = new DomTime();
                v->read(reader);
                setElementTime(v);
                continue;
            }
            if (!tag.compare(u"datetime"_s, Qt::CaseInsensitive)) {
                auto *v = new DomDateTime();
                v->read(reader);
                setElementDateTime(v);
                continue;
            }
            if (!tag.compare(u"pointf"_s, Qt::CaseInsensitive)) {
                auto *v = new DomPointF();
                v->read(reader);
                setElementPointF(v);
                continue;
            }
            if (!tag.compare(u"rectf"_s, Qt::CaseInsensitive)) {
                auto *v = new DomRectF();
                v->read(reader);
                setElementRectF(v);
                continue;
            }
            if (!tag.compare(u"sizef"_s, Qt::CaseInsensitive)) {
                auto *v = new DomSizeF();
                v->read(reader);
                setElementSizeF(v);
                continue;
            }
            if (!tag.compare(u"longlong"_s, Qt::CaseInsensitive)) {
                setElementLongLong(reader.readElementText().toLongLong());
                continue;
            }
            if (!tag.compare(u"char"_s, Qt::CaseInsensitive)) {
                auto *v = new DomChar();
                v->read(reader);
                setElementChar(v);
                continue;
            }
            if (!tag.compare(u"url"_s, Qt::CaseInsensitive)) {
                auto *v = new DomUrl();
                v->read(reader);
                setElementUrl(v);
                continue;
            }
            if (!tag.compare(u"uint"_s, Qt::CaseInsensitive)) {
                setElementUInt(reader.readElementText().toUInt());
                continue;
            }
            if (!tag.compare(u"ulonglong"_s, Qt::CaseInsensitive)) {
                setElementULongLong(reader.readElementText().toULongLong());
                continue;
            }
            if (!tag.compare(u"brush"_s, Qt::CaseInsensitive)) {
                auto *v = new DomBrush();
                v->read(reader);
                setElementBrush(v);
                continue;
            }
            reader.raiseError("Unexpected element "_L1 + tag);
        }
            break;
        case QXmlStreamReader::EndElement :
            return;
        default :
            break;
        }
    }
}